

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::QueryAPICase::iterate(QueryAPICase *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  uint uVar1;
  pointer puVar2;
  EGLenum EVar3;
  uint uVar4;
  Library *egl;
  EGLDisplay display;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var5;
  long lVar6;
  EGLenum api;
  vector<unsigned_int,_std::allocator<unsigned_int>_> supportedAPIs;
  uint local_1fc;
  TestLog *local_1f8;
  QueryAPICase *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  CallLogWrapper *local_1d0;
  EGLDisplay local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  local_1f8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  eglu::getClientAPIs(&local_1e8,egl,display);
  (this->super_CallLogWrapper).m_enableLog = true;
  local_1f0 = this;
  EVar3 = eglu::CallLogWrapper::eglQueryAPI(&this->super_CallLogWrapper);
  puVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (EVar3 == 0x30a0) {
LAB_00e5c39d:
    puVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_1b0._0_4_ = 0x30a0;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    if (_Var5._M_current != puVar2) goto LAB_00e5c497;
    local_1b0._0_8_ = local_1f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported.",0x47);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_4_ = 0x30a0;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    if (_Var5._M_current == puVar2) {
      if (EVar3 == 0x3038) goto LAB_00e5c497;
      goto LAB_00e5c39d;
    }
    local_1b0._0_8_ = local_1f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported.",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            ((local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
             ,"Invalid default value");
LAB_00e5c497:
  this_00 = (ostringstream *)(local_1b0 + 8);
  this_01 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  local_1d0 = &this->super_CallLogWrapper;
  local_1c8 = display;
  do {
    local_1fc = *(uint *)((long)&DAT_01ba2e04 + lVar6);
    local_1b0._0_8_ = local_1f8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    puVar2 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_1fc);
    if (_Var5._M_current == puVar2) {
      local_1b0._0_8_ = local_1f8;
      std::__cxx11::ostringstream::ostringstream(this_01);
      local_1c0.m_getName = eglu::getAPIName;
      local_1c0.m_value = local_1fc;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," not supported.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_138);
    }
    else {
      (**egl->_vptr_Library)(egl,(ulong)local_1fc);
      uVar1 = local_1fc;
      uVar4 = (*egl->_vptr_Library[0x28])(egl);
      if (uVar1 != uVar4) {
        local_1b0._0_8_ = local_1f8;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"  Fail, return value does not match previously bound API.",
                   0x39);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid return value");
      }
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  (local_1f0->super_CallLogWrapper).m_enableLog = false;
  eglu::CallLogWrapper::eglTerminate(local_1d0,local_1c8);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&			egl				= m_eglTestCtx.getLibrary();
		EGLDisplay				display			= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		tcu::TestLog&			log				= m_testCtx.getLog();
		const EGLenum			apis[]			= { EGL_OPENGL_API, EGL_OPENGL_ES_API, EGL_OPENVG_API };
		const vector<EGLenum>	supportedAPIs	= eglu::getClientAPIs(egl, display);

		enableLogging(true);

		{
			const EGLenum	api	= eglQueryAPI();

			if (api != EGL_OPENGL_ES_API && (de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
			else if (api != EGL_NONE && !(de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(apis); ndx++)
		{
			const EGLenum	api	= apis[ndx];

			log << TestLog::Message << TestLog::EndMessage;

			if (de::contains(supportedAPIs.begin(), supportedAPIs.end(), api))
			{
				egl.bindAPI(api);

				if (api != egl.queryAPI())
				{
					log << TestLog::Message << "  Fail, return value does not match previously bound API." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
				}
			}
			else
			{
				log << TestLog::Message << eglu::getAPIStr(api) << " not supported." << TestLog::EndMessage;
			}
		}

		enableLogging(false);
		eglTerminate(display);
		return STOP;
	}